

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O1

vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
* __thiscall
deqp::gles2::Performance::anon_unknown_1::BinaryOpCase::generateProgramData
          (vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
           *__return_storage_ptr__,BinaryOpCase *this)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  long *plVar5;
  ulong uVar6;
  size_type *psVar7;
  ulong uVar8;
  ulong uVar9;
  int i_4;
  ostringstream *this_00;
  ulong uVar10;
  int i_2;
  uint uVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  int i;
  int iVar15;
  byte bVar16;
  int unrollNdx;
  vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  attributes;
  string description;
  ostringstream vtx;
  ostringstream frag;
  undefined1 auStack_678 [8];
  CaseType local_670;
  int local_66c;
  char *local_668;
  ulong local_660;
  char *local_658;
  string local_650;
  vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  *local_630;
  undefined1 *local_628;
  undefined8 uStack_620;
  Vec4 local_618;
  float local_608 [4];
  Vec4 local_5f8;
  float local_5e8 [4];
  Vec4 local_5d8;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a0;
  char *local_598;
  long *local_590 [2];
  long local_580 [2];
  AttribSpec local_570;
  ProgramContext local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498 [3];
  ios_base local_428 [264];
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5a0 = &this->m_op;
  local_660 = 0;
  local_630 = __return_storage_ptr__;
  do {
    local_670 = (this->super_OperatorPerformanceCase).m_caseType;
    local_668 = glu::getPrecisionName(this->m_precision);
    pcVar14 = local_668;
    if (this->m_precision == PRECISION_LOWP) {
      pcVar14 = "mediump";
    }
    if (3 < this->m_type - TYPE_INT) {
      pcVar14 = local_668;
    }
    pcVar2 = glu::getDataTypeName(this->m_type);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    this_00 = (ostringstream *)local_1a8;
    if (local_670 == CASETYPE_VERTEX) {
      this_00 = (ostringstream *)local_320;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"attribute highp vec4 a_position;\n",0x21);
    iVar15 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"attribute ",10);
      if (pcVar14 == (char *)0x0) {
        std::ios::clear((int)auStack_678 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x358);
      }
      else {
        sVar3 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar14,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," vec4 a_in",10);
      poVar4 = (ostream *)std::ostream::operator<<(local_320,iVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
      iVar15 = iVar15 + 1;
    } while (iVar15 != 5);
    if (local_670 == CASETYPE_VERTEX) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"varying mediump vec4 v_color;\n",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"varying mediump vec4 v_color;\n",0x1e);
    }
    else {
      iVar15 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"varying ",8);
        if (pcVar14 == (char *)0x0) {
          std::ios::clear((int)auStack_678 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x358);
        }
        else {
          sVar3 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar14,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," vec4 v_in",10);
        poVar4 = (ostream *)std::ostream::operator<<(local_320,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"varying ",8);
        if (pcVar14 == (char *)0x0) {
          std::ios::clear((int)auStack_678 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x4d0);
        }
        else {
          sVar3 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar14,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," vec4 v_in",10);
        poVar4 = (ostream *)std::ostream::operator<<(local_1a8,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
        iVar15 = iVar15 + 1;
      } while (iVar15 != 5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"uniform mediump int u_numLoopIterations;\n",0x29);
    if (local_670 == CASETYPE_VERTEX) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"uniform mediump float u_zero;\n",0x1e);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"void main()\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"{\n",2);
    if (local_670 != CASETYPE_VERTEX) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"\tgl_Position = a_position;\n",0x1b);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main()\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
    local_598 = "v_";
    if (local_670 == CASETYPE_VERTEX) {
      local_598 = "a_";
    }
    uVar11 = 0;
    local_658 = pcVar2;
    do {
      local_66c = glu::getDataTypeScalarSize(this->m_type);
      bVar16 = 1;
      if (3 < this->m_type - TYPE_INT) {
        bVar16 = (this->m_useSwizzle ^ 1U) & this->m_type != TYPE_FLOAT_VEC4;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
      pcVar14 = local_668;
      iVar15 = (int)this_00;
      if (local_668 == (char *)0x0) {
        std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
      }
      else {
        sVar3 = strlen(local_668);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar14,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      pcVar14 = local_658;
      if (local_658 == (char *)0x0) {
        std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
      }
      else {
        sVar3 = strlen(local_658);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar14,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," in",3);
      poVar4 = (ostream *)std::ostream::operator<<(this_00,uVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
      pcVar14 = local_658;
      if (bVar16 != 0) {
        if (local_658 == (char *)0x0) {
          std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
        }
        else {
          sVar3 = strlen(local_658);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar14,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_598,2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"in",2);
      std::ostream::operator<<(this_00,uVar11);
      if (this->m_useSwizzle == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".",1);
        pcVar14 = *(char **)(s_swizzles + (long)(local_66c + -1) * 8 + (ulong)((uVar11 & 3) << 5));
        if (pcVar14 == (char *)0x0) {
          std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
        }
        else {
          sVar3 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar14,sVar3);
        }
      }
      if (bVar16 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,";\n",2);
      pcVar14 = local_658;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 5);
    iVar12 = 0;
    while (iVar12 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
      pcVar2 = local_668;
      if (local_668 == (char *)0x0) {
        std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
      }
      else {
        sVar3 = strlen(local_668);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar2,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      if (pcVar14 == (char *)0x0) {
        std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar14,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," acc",4);
      poVar4 = (ostream *)std::ostream::operator<<(this_00,iVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"a",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = in",5);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
      pcVar2 = local_668;
      if (local_668 == (char *)0x0) {
        std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
      }
      else {
        sVar3 = strlen(local_668);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar2,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      if (pcVar14 == (char *)0x0) {
        std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar14,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," acc",4);
      poVar4 = (ostream *)std::ostream::operator<<(this_00,iVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"b",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = in",5);
      iVar12 = iVar12 + 1;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"\tfor (int i = 0; i < u_numLoopIterations; i++)\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t{\n",3);
    local_66c = (uint)((int)local_660 != 1) * 2 + 2;
    iVar12 = 0;
    do {
      iVar13 = 0;
      do {
        if (iVar13 != 0 || iVar12 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t\tacc",5);
        poVar4 = (ostream *)std::ostream::operator<<(this_00,iVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"a = acc",7);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"b ",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(this->m_op)._M_dataplus._M_p,(this->m_op)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," acc",4);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"a",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t\tacc",5);
        poVar4 = (ostream *)std::ostream::operator<<(this_00,iVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"b = acc",7);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"a ",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(this->m_op)._M_dataplus._M_p,(this->m_op)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," acc",4);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"b",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
        iVar13 = iVar13 + 1;
      } while (iVar13 != 4);
      iVar12 = iVar12 + 1;
    } while (iVar12 != local_66c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t}\n",3);
    pcVar2 = local_658;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
    pcVar14 = local_668;
    if (local_668 == (char *)0x0) {
      std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar3 = strlen(local_668);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar14,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," res =",6);
    iVar15 = 0;
    do {
      if (iVar15 == 0) {
        local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
        local_498[0]._M_string_length = 0;
        local_498[0].field_2._M_allocated_capacity =
             local_498[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        std::operator+(local_498," ",local_5a0);
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this_00,local_498[0]._M_dataplus._M_p,
                          local_498[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," acc",4);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"b",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
        operator_delete(local_498[0]._M_dataplus._M_p,
                        (ulong)(local_498[0].field_2._M_allocated_capacity + 1));
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 != 4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"\tmediump vec4 color = ",0x16);
    if (this->m_type == TYPE_FLOAT_VEC4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"res",3);
    }
    else {
      iVar15 = glu::getDataTypeScalarSize(this->m_type);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"vec4(res",8);
      if (iVar15 < 4) {
        iVar15 = 4 - iVar15;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          pcVar14 = "0.0";
          if (iVar15 == 1) {
            pcVar14 = "1.0";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar14,3);
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\t",1);
    pcVar14 = "gl_FragColor";
    if (local_670 == CASETYPE_VERTEX) {
      pcVar14 = "v_color";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar14,(ulong)(local_670 != CASETYPE_VERTEX) * 5 + 7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," = color;\n",10);
    if (local_670 == CASETYPE_VERTEX) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"\tgl_Position = a_position + u_zero*color;\n",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\tgl_FragColor = v_color;\n",0x19);
    }
    else {
      iVar15 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\tv_in",5);
        poVar4 = (ostream *)std::ostream::operator<<(local_320,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = a_in",7);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
        iVar15 = iVar15 + 1;
      } while (iVar15 != 5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
    local_5b8.
    super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_5b8.
    super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5b8.
    super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar11 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
      std::ostream::operator<<(local_498,uVar11);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
      std::ios_base::~ios_base(local_428);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_590,0,(char *)0x0,0x1ceab5f);
      local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_650.field_2._M_allocated_capacity = *psVar7;
        local_650.field_2._8_8_ = plVar5[3];
      }
      else {
        local_650.field_2._M_allocated_capacity = *psVar7;
        local_650._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_650._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_5c8 = 0x4000000040000000;
      uStack_5c0 = 0x3f80000040000000;
      uVar6 = (ulong)uVar11;
      if (uVar11 == 4) {
        uVar6 = 0;
      }
      uVar1 = uVar11 + 1;
      uVar8 = (ulong)((uVar1 & 3) << 2);
      uVar9 = (ulong)((uVar11 & 3 ^ 2) << 2);
      uVar10 = (ulong)((uVar11 - 1 & 3) << 2);
      local_498[0]._M_dataplus._M_p._4_4_ = *(undefined4 *)((long)&local_5c8 + uVar8);
      local_498[0]._M_dataplus._M_p._0_4_ = *(undefined4 *)((long)&local_5c8 + uVar6 * 4);
      local_498[0]._M_string_length =
           CONCAT44(*(undefined4 *)((long)&local_5c8 + uVar10),
                    *(undefined4 *)((long)&local_5c8 + uVar9));
      local_5e8[0] = 1.0;
      local_5e8[1] = 2.0;
      local_5e8[2] = 1.0;
      local_5e8[3] = 2.0;
      local_5d8.m_data[0] = local_5e8[uVar6];
      local_5d8.m_data[1] = *(float *)((long)local_5e8 + uVar8);
      local_5d8.m_data[2] = *(float *)((long)local_5e8 + uVar9);
      local_5d8.m_data[3] = *(float *)((long)local_5e8 + uVar10);
      local_608[0] = 2.0;
      local_608[1] = 1.0;
      local_608[2] = 2.0;
      local_608[3] = 2.0;
      local_5f8.m_data[0] = local_608[uVar6];
      local_5f8.m_data[1] = *(float *)((long)local_608 + uVar8);
      local_5f8.m_data[2] = *(float *)((long)local_608 + uVar9);
      local_5f8.m_data[3] = *(float *)((long)local_608 + uVar10);
      local_628 = &DAT_3f8000003f800000;
      uStack_620 = 0x3f80000040000000;
      local_618.m_data[0] = *(float *)((long)&local_628 + uVar6 * 4);
      local_618.m_data[1] = *(float *)((long)&local_628 + uVar8);
      local_618.m_data[2] = *(float *)((long)&local_628 + uVar9);
      local_618.m_data[3] = *(float *)((long)&local_628 + uVar10);
      OperatorPerformanceCase::AttribSpec::AttribSpec
                (&local_570,local_650._M_dataplus._M_p,(Vec4 *)local_498,&local_5d8,&local_5f8,
                 &local_618);
      std::
      vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
      ::push_back(&local_5b8,&local_570);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570.name._M_dataplus._M_p != &local_570.name.field_2) {
        operator_delete(local_570.name._M_dataplus._M_p,
                        local_570.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_650._M_dataplus._M_p != &local_650.field_2) {
        operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
      }
      if (local_590[0] != local_580) {
        operator_delete(local_590[0],local_580[0] + 1);
      }
      uVar11 = uVar1;
    } while (uVar1 != 5);
    local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
    local_570.name._M_dataplus._M_p = (pointer)0x1d;
    local_498[0]._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)local_498,(ulong)&local_570);
    local_498[0].field_2._M_allocated_capacity = local_570.name._M_dataplus._M_p;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0xd) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0xe) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0xf) = 'g';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0x10) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0x11) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0x12) = 'm';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0x13) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0x14) = 'w';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0x15) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0x16) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0x17) = 'h';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0x18) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0x19) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0x1a) = 'h';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0x1b) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0x1c) = ' ';
    *(undefined8 *)local_498[0]._M_dataplus._M_p = 0x2073692073696854;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 8) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 9) = 'h';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 10) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0xb) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0xc) = 'p';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0xd) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0xe) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p + 0xf) = 'g';
    local_498[0]._M_string_length = (size_type)local_570.name._M_dataplus._M_p;
    local_498[0]._M_dataplus._M_p[(long)local_570.name._M_dataplus._M_p] = '\0';
    std::__cxx11::string::append((char *)local_498);
    std::__cxx11::string::append((char *)local_498);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    OperatorPerformanceCase::ProgramContext::ProgramContext
              (&local_510,&local_570.name,&local_650,&local_5b8,local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._M_dataplus._M_p != &local_650.field_2) {
      operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570.name._M_dataplus._M_p != &local_570.name.field_2) {
      operator_delete(local_570.name._M_dataplus._M_p,
                      local_570.name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
      operator_delete(local_498[0]._M_dataplus._M_p,
                      (ulong)(local_498[0].field_2._M_allocated_capacity + 1));
    }
    std::
    vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
    ::~vector(&local_5b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
    std::
    vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
    ::push_back(local_630,&local_510);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510.description._M_dataplus._M_p != &local_510.description.field_2) {
      operator_delete(local_510.description._M_dataplus._M_p,
                      local_510.description.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
    ::~vector(&local_510.attributes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510.fragShaderSource._M_dataplus._M_p != &local_510.fragShaderSource.field_2) {
      operator_delete(local_510.fragShaderSource._M_dataplus._M_p,
                      local_510.fragShaderSource.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510.vertShaderSource._M_dataplus._M_p != &local_510.vertShaderSource.field_2) {
      operator_delete(local_510.vertShaderSource._M_dataplus._M_p,
                      local_510.vertShaderSource.field_2._M_allocated_capacity + 1);
    }
    iVar15 = (int)local_660;
    local_660 = (ulong)(iVar15 + 1);
  } while (iVar15 == 0);
  return local_630;
}

Assistant:

vector<BinaryOpCase::ProgramContext> BinaryOpCase::generateProgramData (void) const
{
	vector<ProgramContext> progData;
	for (int i = 0; i < PROGRAM_LAST; i++)
		progData.push_back(generateSingleProgramData((ProgramID)i));
	return progData;
}